

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

boolean smoothing_ok(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  short *psVar3;
  undefined8 uVar4;
  int *piVar5;
  long in_RDI;
  int *prev_coef_bits_latch;
  int *coef_bits_latch;
  int *prev_coef_bits;
  int *coef_bits;
  JQUANT_TBL *qtable;
  jpeg_component_info *compptr;
  int coefi;
  int ci;
  boolean smoothing_useful;
  my_coef_ptr_conflict coef;
  long local_58;
  int *local_50;
  long local_30;
  int local_24;
  int local_20;
  boolean local_1c;
  boolean local_4;
  
  lVar2 = *(long *)(in_RDI + 0x230);
  local_1c = 0;
  if ((*(int *)(in_RDI + 0x138) == 0) || (*(long *)(in_RDI + 0xc0) == 0)) {
    local_4 = 0;
  }
  else {
    if (*(long *)(lVar2 + 0xe0) == 0) {
      uVar4 = (*(code *)**(undefined8 **)(in_RDI + 8))
                        (in_RDI,1,(long)(*(int *)(in_RDI + 0x38) << 1) * 0x28);
      *(undefined8 *)(lVar2 + 0xe0) = uVar4;
    }
    local_50 = *(int **)(lVar2 + 0xe0);
    local_58 = *(long *)(lVar2 + 0xe0) + (long)(*(int *)(in_RDI + 0x38) * 10) * 4;
    local_20 = 0;
    local_30 = *(long *)(in_RDI + 0x130);
    for (; local_20 < *(int *)(in_RDI + 0x38); local_20 = local_20 + 1) {
      psVar3 = *(short **)(local_30 + 0x50);
      if (psVar3 == (short *)0x0) {
        return 0;
      }
      if ((((((*psVar3 == 0) || (psVar3[1] == 0)) || (psVar3[8] == 0)) ||
           ((psVar3[0x10] == 0 || (psVar3[9] == 0)))) ||
          ((psVar3[2] == 0 || ((psVar3[3] == 0 || (psVar3[10] == 0)))))) ||
         ((psVar3[0x11] == 0 || (psVar3[0x18] == 0)))) {
        return 0;
      }
      piVar5 = (int *)(*(long *)(in_RDI + 0xc0) + (long)local_20 * 0x100);
      lVar2 = *(long *)(in_RDI + 0xc0);
      iVar1 = *(int *)(in_RDI + 0x38);
      if (*piVar5 < 0) {
        return 0;
      }
      *local_50 = *piVar5;
      for (local_24 = 1; local_24 < 10; local_24 = local_24 + 1) {
        if (*(int *)(in_RDI + 0xac) < 2) {
          *(undefined4 *)(local_58 + (long)local_24 * 4) = 0xffffffff;
        }
        else {
          *(undefined4 *)(local_58 + (long)local_24 * 4) =
               *(undefined4 *)(lVar2 + (long)(local_20 + iVar1) * 0x100 + (long)local_24 * 4);
        }
        local_50[local_24] = piVar5[local_24];
        if (piVar5[local_24] != 0) {
          local_1c = 1;
        }
      }
      local_50 = local_50 + 10;
      local_58 = local_58 + 0x28;
      local_30 = local_30 + 0x60;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

LOCAL(boolean)
smoothing_ok(j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  boolean smoothing_useful = FALSE;
  int ci, coefi;
  jpeg_component_info *compptr;
  JQUANT_TBL *qtable;
  int *coef_bits, *prev_coef_bits;
  int *coef_bits_latch, *prev_coef_bits_latch;

  if (!cinfo->progressive_mode || cinfo->coef_bits == NULL)
    return FALSE;

  /* Allocate latch area if not already done */
  if (coef->coef_bits_latch == NULL)
    coef->coef_bits_latch = (int *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  cinfo->num_components * 2 *
                                  (SAVED_COEFS * sizeof(int)));
  coef_bits_latch = coef->coef_bits_latch;
  prev_coef_bits_latch =
    &coef->coef_bits_latch[cinfo->num_components * SAVED_COEFS];

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* All components' quantization values must already be latched. */
    if ((qtable = compptr->quant_table) == NULL)
      return FALSE;
    /* Verify DC & first 9 AC quantizers are nonzero to avoid zero-divide. */
    if (qtable->quantval[0] == 0 ||
        qtable->quantval[Q01_POS] == 0 ||
        qtable->quantval[Q10_POS] == 0 ||
        qtable->quantval[Q20_POS] == 0 ||
        qtable->quantval[Q11_POS] == 0 ||
        qtable->quantval[Q02_POS] == 0 ||
        qtable->quantval[Q03_POS] == 0 ||
        qtable->quantval[Q12_POS] == 0 ||
        qtable->quantval[Q21_POS] == 0 ||
        qtable->quantval[Q30_POS] == 0)
      return FALSE;
    /* DC values must be at least partly known for all components. */
    coef_bits = cinfo->coef_bits[ci];
    prev_coef_bits = cinfo->coef_bits[ci + cinfo->num_components];
    if (coef_bits[0] < 0)
      return FALSE;
    coef_bits_latch[0] = coef_bits[0];
    /* Block smoothing is helpful if some AC coefficients remain inaccurate. */
    for (coefi = 1; coefi < SAVED_COEFS; coefi++) {
      if (cinfo->input_scan_number > 1)
        prev_coef_bits_latch[coefi] = prev_coef_bits[coefi];
      else
        prev_coef_bits_latch[coefi] = -1;
      coef_bits_latch[coefi] = coef_bits[coefi];
      if (coef_bits[coefi] != 0)
        smoothing_useful = TRUE;
    }
    coef_bits_latch += SAVED_COEFS;
    prev_coef_bits_latch += SAVED_COEFS;
  }

  return smoothing_useful;
}